

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

int __thiscall
Centaurus::ATNMachine<wchar_t>::count_incoming_edges(ATNMachine<wchar_t> *this,int index,int *where)

{
  pointer pAVar1;
  const_reference pvVar2;
  ATNTransition<wchar_t> *t;
  pointer pAVar3;
  int iVar4;
  int i;
  ulong __n;
  
  iVar4 = 0;
  for (__n = 0; __n < (ulong)(((long)(this->m_nodes).
                                     super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_nodes).
                                    super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x98);
      __n = __n + 1) {
    pvVar2 = std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
             ::at(&this->m_nodes,__n);
    pAVar1 = (pvVar2->m_transitions).
             super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar3 = (pvVar2->m_transitions).
                  super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar3 != pAVar1; pAVar3 = pAVar3 + 1)
    {
      if (pAVar3->m_dest == index) {
        iVar4 = iVar4 + 1;
        *where = (int)__n;
      }
    }
  }
  if (iVar4 != 1) {
    *where = -1;
  }
  return iVar4;
}

Assistant:

int count_incoming_edges(int index, int& where) const
    {
        int count = 0;
        for (int i = 0; i < m_nodes.size(); i++)
        {
            for (const auto& t : m_nodes.at(i).get_transitions())
            {
                if (t.dest() == index)
                {
                    where = i;
                    count++;
                    //break;  //Overlapping edges should be counted as one.
                }
            }
        }
        if (count != 1) where = -1;
        return count;
    }